

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.h
# Opt level: O2

void __thiscall gulcalc::~gulcalc(gulcalc *this)

{
  if (this->ibuf_ != (uchar *)0x0) {
    operator_delete__(this->ibuf_);
  }
  if (this->corrbuf_ != (uchar *)0x0) {
    operator_delete__(this->corrbuf_);
  }
  if (this->cbuf_ != (uchar *)0x0) {
    operator_delete__(this->cbuf_);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->mode1UsedCoverageIDs_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<prob_mean,_std::allocator<prob_mean>_>::~_Vector_base
            (&(this->bin_lookup_).super__Vector_base<prob_mean,_std::allocator<prob_mean>_>);
  std::
  _Rb_tree<prob_mean,_std::pair<const_prob_mean,_int>,_std::_Select1st<std::pair<const_prob_mean,_int>_>,_std::less<prob_mean>,_std::allocator<std::pair<const_prob_mean,_int>_>_>
  ::~_Rb_tree(&(this->bin_map_)._M_t);
  std::
  vector<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
  ::~vector(&this->mode1_stats_);
  std::
  vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
  ::~vector(&this->fullCorr_);
  std::
  vector<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>,_std::allocator<std::vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>_>_>
  ::~vector(&this->mode1_);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&this->cov_);
  gulcalcopts::~gulcalcopts(&this->opt_);
  return;
}

Assistant:

~gulcalc() {
		delete [] ibuf_;
		delete [] corrbuf_;
		delete [] cbuf_;
	}